

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    cVar2 = '\a';
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_0015be69:
        cVar2 = '\x1d';
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    cVar2 = '\b';
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0015be69;
    cVar2 = '\0';
  }
  iVar5 = 0x16;
  switch(cVar2) {
  case '\x05':
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    break;
  case '\x06':
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    break;
  case '\a':
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    break;
  case '\b':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x17':
    break;
  case '\t':
  case '\n':
  case '\x15':
    goto switchD_0015be8e_caseD_9;
  case '\x16':
  case '\x18':
switchD_0015be8e_caseD_16:
    if (ptr + 2 == end) {
      return -1;
    }
    lVar6 = (long)end - (long)ptr;
    ptr = ptr + 2;
    do {
      lVar6 = lVar6 + -2;
      bVar1 = ((byte *)ptr)[1];
      if (bVar1 < 0xdc) {
        uVar3 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar3 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
          }
          else {
LAB_0015bf77:
            uVar3 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar3 = 8;
      }
      else {
        if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0015bf77;
        uVar3 = 0;
      }
      iVar4 = 0;
      iVar5 = 0;
      switch(uVar3) {
      case 5:
        iVar5 = iVar4;
        if (lVar6 < 2) {
          return -2;
        }
        goto switchD_0015be8e_caseD_9;
      case 6:
        iVar5 = iVar4;
        if (lVar6 < 3) {
          return -2;
        }
        goto switchD_0015be8e_caseD_9;
      case 7:
        iVar5 = iVar4;
        if (lVar6 < 4) {
          return -2;
        }
      default:
        goto switchD_0015be8e_caseD_9;
      case 0x12:
        ptr = (char *)((byte *)ptr + 2);
        iVar5 = 0x1c;
        goto switchD_0015be8e_caseD_9;
      case 0x1d:
        iVar5 = iVar4;
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)*ptr >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_0015be8e_caseD_9;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        ptr = (char *)((byte *)ptr + 2);
        if (ptr == end) {
          return -1;
        }
      }
    } while( true );
  default:
    if (cVar2 == '\x1e') goto switchD_0015be8e_caseD_9;
    if ((cVar2 == '\x1d') &&
       ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) != 0)) goto switchD_0015be8e_caseD_16;
  }
  iVar5 = 0;
switchD_0015be8e_caseD_9:
  *nextTokPtr = ptr;
  return iVar5;
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}